

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

bool __thiscall NJamSpell::TTokenizer::LoadAlphabet(TTokenizer *this,string *alphabetFile)

{
  _Hashtable<wchar_t,wchar_t,std::allocator<wchar_t>,std::__detail::_Identity,std::equal_to<wchar_t>,std::hash<wchar_t>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *p_Var1;
  __node_base_ptr p_Var2;
  __node_base_ptr p_Var3;
  undefined4 uVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  undefined1 local_c0 [8];
  string data;
  unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
  alphabet;
  wstring wdata;
  int local_34 [2];
  wchar_t chr;
  
  LoadFile((string *)local_c0,alphabetFile);
  if (data._M_dataplus._M_p == (pointer)0x0) {
    bVar7 = false;
  }
  else {
    UTF8ToWide((wstring *)&alphabet._M_h._M_single_bucket,(string *)local_c0);
    p_Var2 = alphabet._M_h._M_single_bucket;
    if (wdata._M_dataplus._M_p == (pointer)0x0) {
      bVar7 = false;
    }
    else {
      lVar5 = (long)wdata._M_dataplus._M_p << 2;
      lVar6 = 0;
      do {
        uVar4 = (**(code **)(*GWctype + 0x40))
                          (GWctype,*(undefined4 *)((long)&p_Var2->_M_nxt + lVar6));
        p_Var3 = alphabet._M_h._M_single_bucket;
        *(undefined4 *)((long)&p_Var2->_M_nxt + lVar6) = uVar4;
        lVar6 = lVar6 + 4;
      } while (lVar5 != lVar6);
      data.field_2._8_8_ = &alphabet._M_h._M_rehash_policy._M_next_resize;
      alphabet._M_h._M_buckets = (__buckets_ptr)0x1;
      alphabet._M_h._M_bucket_count = 0;
      alphabet._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      alphabet._M_h._M_element_count._0_4_ = 0x3f800000;
      alphabet._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      alphabet._M_h._M_rehash_policy._4_4_ = 0;
      alphabet._M_h._M_rehash_policy._M_next_resize = 0;
      if (wdata._M_dataplus._M_p != (pointer)0x0) {
        lVar5 = 0;
        p_Var1 = (_Hashtable<wchar_t,wchar_t,std::allocator<wchar_t>,std::__detail::_Identity,std::equal_to<wchar_t>,std::hash<wchar_t>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)((long)&data.field_2 + 8);
        do {
          local_34[0] = *(int *)((long)&p_Var3->_M_nxt + lVar5);
          if ((local_34[0] != 10) && (local_34[0] != 0xd)) {
            wdata.field_2._8_8_ = p_Var1;
            std::
            _Hashtable<wchar_t,wchar_t,std::allocator<wchar_t>,std::__detail::_Identity,std::equal_to<wchar_t>,std::hash<wchar_t>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<wchar_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wchar_t,false>>>>
                      (p_Var1,local_34,(undefined1 *)((long)&wdata.field_2 + 8));
          }
          lVar5 = lVar5 + 4;
        } while ((long)wdata._M_dataplus._M_p << 2 != lVar5);
      }
      bVar7 = alphabet._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0;
      if ((bVar7) &&
         ((unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
           *)((long)&data.field_2 + 8) != &this->Alphabet)) {
        std::
        _Hashtable<wchar_t,wchar_t,std::allocator<wchar_t>,std::__detail::_Identity,std::equal_to<wchar_t>,std::hash<wchar_t>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_assign_elements<std::_Hashtable<wchar_t,wchar_t,std::allocator<wchar_t>,std::__detail::_Identity,std::equal_to<wchar_t>,std::hash<wchar_t>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                  ((_Hashtable<wchar_t,wchar_t,std::allocator<wchar_t>,std::__detail::_Identity,std::equal_to<wchar_t>,std::hash<wchar_t>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&this->Alphabet,
                   (_Hashtable<wchar_t,_wchar_t,_std::allocator<wchar_t>,_std::__detail::_Identity,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)((long)&data.field_2 + 8));
      }
      std::
      _Hashtable<wchar_t,_wchar_t,_std::allocator<wchar_t>,_std::__detail::_Identity,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<wchar_t,_wchar_t,_std::allocator<wchar_t>,_std::__detail::_Identity,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)((long)&data.field_2 + 8));
    }
    if (alphabet._M_h._M_single_bucket != (__node_base_ptr)&wdata._M_string_length) {
      operator_delete(alphabet._M_h._M_single_bucket);
    }
  }
  if (local_c0 != (undefined1  [8])&data._M_string_length) {
    operator_delete((void *)local_c0);
  }
  return bVar7;
}

Assistant:

bool TTokenizer::LoadAlphabet(const std::string& alphabetFile) {
    std::string data = LoadFile(alphabetFile);
    if (data.empty()) {
        return false;
    }
    std::wstring wdata = UTF8ToWide(data);
    if (wdata.empty()) {
        return false;
    }
    ToLower(wdata);
    std::unordered_set<wchar_t> alphabet;
    for (auto chr: wdata) {
        if (chr == 10 || chr == 13) {
            continue;
        }
        alphabet.insert(chr);
    }
    if (alphabet.empty()) {
        return false;
    }
    Alphabet = alphabet;
    return true;
}